

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O2

int must_warn(int ret)

{
  int *piVar1;
  
  if (-1 < ret) {
    return 0;
  }
  piVar1 = __errno_location();
  return (int)(*piVar1 != 0x69 && *piVar1 != 4);
}

Assistant:

static inline int must_warn(int ret)
{
	if (ret >= 0)
		return 0;
	switch (errno) {
	case EINTR:
	case ENOBUFS:
		return 0;
	}
	return 1;
}